

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O2

void __thiscall Potassco::SmodelsConvert::flushSymbols(SmodelsConvert *this)

{
  pointer pSVar1;
  AbstractProgram *pAVar2;
  char *__s;
  pointer pSVar3;
  Lit_t x;
  uint local_54;
  uint *local_50;
  undefined8 local_48;
  char *local_40;
  size_t local_38;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<Potassco::SmodelsConvert::SmData::Symbol*,std::vector<Potassco::SmodelsConvert::SmData::Symbol,std::allocator<Potassco::SmodelsConvert::SmData::Symbol>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->data_->output_).
             super__Vector_base<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->data_->output_).
             super__Vector_base<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pSVar1 = (this->data_->output_).
           super__Vector_base<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar3 = (this->data_->output_).
                super__Vector_base<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1) {
    local_54 = *(uint *)pSVar3 & 0x7fffffff;
    pAVar2 = this->out_;
    __s = pSVar3->name;
    local_38 = strlen(__s);
    local_50 = &local_54;
    local_48 = 1;
    local_40 = __s;
    (*pAVar2->_vptr_AbstractProgram[8])(pAVar2,&local_40,&local_50);
  }
  return;
}

Assistant:

void SmodelsConvert::flushSymbols() {
	std::sort(data_->output_.begin(), data_->output_.end());
	for (SmData::OutVec::const_iterator it = data_->output_.begin(), end = data_->output_.end(); it != end; ++it) {
		Lit_t x = static_cast<Lit_t>(it->atom);
		out_.output(toSpan(it->name, std::strlen(it->name)), toSpan(&x, 1));
	}
}